

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outelements(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  point pt;
  point pt_00;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  double *pdVar13;
  long lVar14;
  undefined8 uVar15;
  double dVar16;
  int local_4a4;
  int local_494;
  int local_490;
  int i_1;
  int i;
  int eextras;
  int elementnumber;
  int highorderindex;
  int attribindex;
  int pointindex;
  int shift;
  int firstindex;
  long ntets;
  int *tlist;
  double *talist;
  point *extralist;
  point p4;
  point p3;
  point p2;
  point p1;
  tetrahedron *tptr;
  char outelefilename [1024];
  FILE *local_20;
  FILE *outfile;
  tetgenio *out_local;
  tetgenmesh *this_local;
  
  local_20 = (FILE *)0x0;
  tlist = (int *)0x0;
  ntets = 0;
  if (out == (tetgenio *)0x0) {
    strcpy((char *)&tptr,this->b->outfilename);
    strcat((char *)&tptr,".ele");
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",&tptr);
    }
    else {
      printf("Writing elements.\n");
    }
  }
  lVar14 = this->tetrahedrons->items - this->hullsize;
  uVar1 = this->numelemattrib;
  if (out == (tetgenio *)0x0) {
    local_20 = fopen((char *)&tptr,"w");
    if (local_20 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",&tptr);
      terminatetetgen(this,1);
    }
    uVar15 = 10;
    if (this->b->order == 1) {
      uVar15 = 4;
    }
    fprintf(local_20,"%ld  %d  %d\n",lVar14,uVar15,(ulong)uVar1);
  }
  else {
    iVar5 = 10;
    if (this->b->order == 1) {
      iVar5 = 4;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = lVar14 * iVar5;
    uVar11 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    piVar12 = (int *)operator_new__(uVar11);
    out->tetrahedronlist = piVar12;
    if (out->tetrahedronlist == (int *)0x0) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this,1);
    }
    if (0 < (int)uVar1) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = lVar14 * (int)uVar1;
      uVar11 = SUB168(auVar4 * ZEXT816(8),0);
      if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      pdVar13 = (double *)operator_new__(uVar11);
      out->tetrahedronattributelist = pdVar13;
      if (out->tetrahedronattributelist == (double *)0x0) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this,1);
      }
    }
    out->numberoftetrahedra = (int)lVar14;
    iVar5 = 10;
    if (this->b->order == 1) {
      iVar5 = 4;
    }
    out->numberofcorners = iVar5;
    out->numberoftetrahedronattributes = uVar1;
    ntets = (long)out->tetrahedronlist;
    tlist = (int *)out->tetrahedronattributelist;
    highorderindex = 0;
    elementnumber = 0;
  }
  if (this->b->zeroindex == 0) {
    local_4a4 = this->in->firstnumber;
  }
  else {
    local_4a4 = 0;
  }
  attribindex = 0;
  if ((this->in->firstnumber == 1) && (local_4a4 == 0)) {
    attribindex = 1;
  }
  memorypool::traversalinit(this->tetrahedrons);
  p1 = (point)tetrahedrontraverse(this);
  i = local_4a4;
  while (p1 != (point)0x0) {
    if (this->b->reversetetori == 0) {
      p2 = (point)p1[4];
      p3 = (point)p1[5];
    }
    else {
      p2 = (point)p1[5];
      p3 = (point)p1[4];
    }
    pt = (point)p1[6];
    pt_00 = (point)p1[7];
    if (out == (tetgenio *)0x0) {
      iVar5 = pointmark(this,p2);
      iVar6 = pointmark(this,p3);
      iVar7 = pointmark(this,pt);
      iVar8 = pointmark(this,pt_00);
      fprintf(local_20,"%5d   %5d %5d %5d %5d",(ulong)(uint)i,(ulong)(uint)(iVar5 - attribindex),
              (ulong)(uint)(iVar6 - attribindex),(ulong)(uint)(iVar7 - attribindex),
              iVar8 - attribindex);
      if (this->b->order == 2) {
        puVar2 = (undefined8 *)p1[0xb];
        iVar5 = pointmark(this,(point)*puVar2);
        iVar6 = pointmark(this,(point)puVar2[1]);
        iVar7 = pointmark(this,(point)puVar2[2]);
        iVar8 = pointmark(this,(point)puVar2[3]);
        iVar9 = pointmark(this,(point)puVar2[4]);
        iVar10 = pointmark(this,(point)puVar2[5]);
        fprintf(local_20,"  %5d %5d %5d %5d %5d %5d",(ulong)(uint)(iVar5 - attribindex),
                (ulong)(uint)(iVar6 - attribindex),(ulong)(uint)(iVar7 - attribindex),
                (ulong)(uint)(iVar8 - attribindex),iVar9 - attribindex,iVar10 - attribindex);
      }
      for (local_490 = 0; local_490 < (int)uVar1; local_490 = local_490 + 1) {
        elemattribute(this,(tetrahedron *)p1,local_490);
        fprintf(local_20,"    %.17g");
      }
      fprintf(local_20,"\n");
    }
    else {
      iVar5 = pointmark(this,p2);
      *(int *)(ntets + (long)highorderindex * 4) = iVar5 - attribindex;
      iVar5 = pointmark(this,p3);
      *(int *)(ntets + (long)(highorderindex + 1) * 4) = iVar5 - attribindex;
      iVar5 = pointmark(this,pt);
      *(int *)(ntets + (long)(highorderindex + 2) * 4) = iVar5 - attribindex;
      iVar5 = pointmark(this,pt_00);
      *(int *)(ntets + (long)(highorderindex + 3) * 4) = iVar5 - attribindex;
      iVar5 = highorderindex + 4;
      if (this->b->order == 2) {
        puVar2 = (undefined8 *)p1[0xb];
        iVar5 = pointmark(this,(point)*puVar2);
        *(int *)(ntets + (long)(highorderindex + 4) * 4) = iVar5 - attribindex;
        iVar5 = pointmark(this,(point)puVar2[1]);
        *(int *)(ntets + (long)(highorderindex + 5) * 4) = iVar5 - attribindex;
        iVar5 = pointmark(this,(point)puVar2[2]);
        *(int *)(ntets + (long)(highorderindex + 6) * 4) = iVar5 - attribindex;
        iVar5 = pointmark(this,(point)puVar2[3]);
        *(int *)(ntets + (long)(highorderindex + 7) * 4) = iVar5 - attribindex;
        iVar5 = pointmark(this,(point)puVar2[4]);
        *(int *)(ntets + (long)(highorderindex + 8) * 4) = iVar5 - attribindex;
        iVar5 = pointmark(this,(point)puVar2[5]);
        *(int *)(ntets + (long)(highorderindex + 9) * 4) = iVar5 - attribindex;
        iVar5 = highorderindex + 10;
      }
      highorderindex = iVar5;
      for (local_490 = 0; local_490 < (int)uVar1; local_490 = local_490 + 1) {
        dVar16 = elemattribute(this,(tetrahedron *)p1,local_490);
        *(double *)(tlist + (long)elementnumber * 2) = dVar16;
        elementnumber = elementnumber + 1;
      }
    }
    setelemindex(this,(tetrahedron *)p1,i);
    if (this->b->metric != 0) {
      for (local_494 = 0; local_494 < 4; local_494 = local_494 + 1) {
        setpoint2tet(this,(point)p1[local_494 + 4],(tetrahedron)p1);
      }
    }
    p1 = (point)tetrahedrontraverse(this);
    i = i + 1;
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_20,"# Generated by %s\n",this->b->commandline);
    fclose(local_20);
  }
  return;
}

Assistant:

void tetgenmesh::outelements(tetgenio* out)
{
  FILE *outfile = NULL;
  char outelefilename[FILENAMESIZE];
  tetrahedron* tptr;
  point p1, p2, p3, p4;
  point *extralist;
  REAL *talist = NULL;
  int *tlist = NULL;
  long ntets;
  int firstindex, shift;
  int pointindex, attribindex;
  int highorderindex = 11; 
  int elementnumber;
  int eextras;
  int i;

  if (out == (tetgenio *) NULL) {
    strcpy(outelefilename, b->outfilename);
    strcat(outelefilename, ".ele");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outelefilename);
    } else {
      printf("Writing elements.\n");
    }
  }

  // The number of tets excluding hull tets.
  ntets = tetrahedrons->items - hullsize;

  eextras = numelemattrib;
  if (out == (tetgenio *) NULL) {
    outfile = fopen(outelefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outelefilename);
      terminatetetgen(this, 1);
    }
    // Number of tetras, points per tetra, attributes per tetra.
    fprintf(outfile, "%ld  %d  %d\n", ntets, b->order == 1 ? 4 : 10, eextras);
  } else {
    // Allocate memory for output tetrahedra.
    out->tetrahedronlist = new int[ntets * (b->order == 1 ? 4 : 10)];
    if (out->tetrahedronlist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    // Allocate memory for output tetrahedron attributes if necessary.
    if (eextras > 0) {
      out->tetrahedronattributelist = new REAL[ntets * eextras];
      if (out->tetrahedronattributelist == (REAL *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    out->numberoftetrahedra = ntets;
    out->numberofcorners = b->order == 1 ? 4 : 10;
    out->numberoftetrahedronattributes = eextras;
    tlist = out->tetrahedronlist;
    talist = out->tetrahedronattributelist;
    pointindex = 0;
    attribindex = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shift.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tptr = tetrahedrontraverse();
  elementnumber = firstindex; // in->firstnumber;
  while (tptr != (tetrahedron *) NULL) {
    if (!b->reversetetori) {
      p1 = (point) tptr[4];
      p2 = (point) tptr[5];
    } else {
      p1 = (point) tptr[5];
      p2 = (point) tptr[4];
    }
    p3 = (point) tptr[6];
    p4 = (point) tptr[7];
    if (out == (tetgenio *) NULL) {
      // Tetrahedron number, indices for four points.
      fprintf(outfile, "%5d   %5d %5d %5d %5d", elementnumber,
              pointmark(p1) - shift, pointmark(p2) - shift,
              pointmark(p3) - shift, pointmark(p4) - shift);
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        // indices for six extra points.
        fprintf(outfile, "  %5d %5d %5d %5d %5d %5d",
          pointmark(extralist[0]) - shift, pointmark(extralist[1]) - shift,
          pointmark(extralist[2]) - shift, pointmark(extralist[3]) - shift,
          pointmark(extralist[4]) - shift, pointmark(extralist[5]) - shift);
      }
      for (i = 0; i < eextras; i++) {
        fprintf(outfile, "    %.17g", elemattribute(tptr, i));
      }
      fprintf(outfile, "\n");
    } else {
      tlist[pointindex++] = pointmark(p1) - shift;
      tlist[pointindex++] = pointmark(p2) - shift;
      tlist[pointindex++] = pointmark(p3) - shift;
      tlist[pointindex++] = pointmark(p4) - shift;
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        tlist[pointindex++] = pointmark(extralist[0]) - shift;
        tlist[pointindex++] = pointmark(extralist[1]) - shift;
        tlist[pointindex++] = pointmark(extralist[2]) - shift;
        tlist[pointindex++] = pointmark(extralist[3]) - shift;
        tlist[pointindex++] = pointmark(extralist[4]) - shift;
        tlist[pointindex++] = pointmark(extralist[5]) - shift;
      }
      for (i = 0; i < eextras; i++) {
        talist[attribindex++] = elemattribute(tptr, i);
      }
    }
    // Remember the index of this element (for counting edges).
    setelemindex(tptr, elementnumber);
	if (b->metric) { // -m option
	  // Update the point-to-tet map, so that every point is pointing
	  //   to a real tet, not a fictious one. Used by .p2t file.
	  for (int i = 0; i < 4; i++) {
	    setpoint2tet((point) (tptr[4 + i]), (tetrahedron) tptr);
	  }
	}
    tptr = tetrahedrontraverse();
    elementnumber++;
  }


  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}